

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::FindFileContainingExtension
          (EncodedDescriptorDatabase *this,StringViewArg containing_type,int field_number,
          FileDescriptorProto *output)

{
  string_view containing_type_00;
  bool bVar1;
  pointer this_00;
  pair<const_void_*,_int> pVar2;
  pair<const_void_*,_int> encoded_file;
  FileDescriptorProto *output_local;
  int field_number_local;
  StringViewArg containing_type_local;
  EncodedDescriptorDatabase *this_local;
  
  this_00 = std::
            unique_ptr<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex,_std::default_delete<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex>_>
            ::operator->(&this->index_);
  containing_type_00 =
       (string_view)
       std::__cxx11::string::operator_cast_to_basic_string_view((string *)containing_type);
  pVar2 = DescriptorIndex::FindExtension(this_00,containing_type_00,field_number);
  encoded_file._12_4_ = 0;
  encoded_file.first = (void *)SUB128(pVar2._0_12_,0);
  encoded_file.second = SUB124(pVar2._0_12_,8);
  bVar1 = MaybeParse(this,encoded_file,output);
  return bVar1;
}

Assistant:

bool EncodedDescriptorDatabase::FindFileContainingExtension(
    StringViewArg containing_type, int field_number,
    FileDescriptorProto* PROTOBUF_NONNULL output) {
  return MaybeParse(index_->FindExtension(containing_type, field_number),
                    output);
}